

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall Args::Arg::checkCorrectnessAfterParsing(Arg *this)

{
  ulong uVar1;
  char *__rhs;
  BaseException *in_RDI;
  allocator *__lhs;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  allocator local_69;
  string local_68 [104];
  
  uVar1 = (**(code **)(*(long *)in_RDI + 0x28))();
  if (((uVar1 & 1) != 0) && (uVar1 = (**(code **)(*(long *)in_RDI + 0x30))(), (uVar1 & 1) == 0)) {
    __rhs = (char *)__cxa_allocate_exception(0x30);
    __lhs = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Undefined required argument \"",__lhs);
    (**(code **)(*(long *)in_RDI + 0x18))(local_a0);
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs)
    ;
    BaseException::BaseException(in_RDI,(String *)__lhs);
    __cxa_throw(__rhs,&BaseException::typeinfo,BaseException::~BaseException);
  }
  return;
}

Assistant:

inline void
Arg::checkCorrectnessAfterParsing() const
{
	if( isRequired() && !isDefined() )
		throw BaseException( String( SL( "Undefined required argument \"" ) ) +
			name() + SL( "\"." ) );
}